

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 640x480at60_25.175MHz.c
# Opt level: O2

void displayLine(void)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x50;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xf);
  }
  iVar1 = 2;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xd);
  }
  iVar1 = 0xc;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(9);
  }
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xd);
  }
  return;
}

Assistant:

void displayLine() {

    // Display
    for(int i=0; i<(640/8); i++) {
        putchar(0b00001111);
    }

    // Front Porch
    for(int i=0; i<(16/8); i++) {
        putchar(0b00001101);
    }

    // hSync
    for(int i=0; i<(96/8); i++) {
        putchar(0b00001001);
    }

    // Back Porch
    for(int i=0; i<(48/8); i++) {
        putchar(0b00001101);
    }

}